

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall
CVmImageLoader::CVmImageLoader(CVmImageLoader *this,CVmImageFile *fp,char *fname,long base_ofs)

{
  char *pcVar1;
  CVmImagePool *pCVar2;
  CVmHashTable *pCVar3;
  CVmHashFunc *pCVar4;
  long lVar5;
  char path [4096];
  char fname_abs [4096];
  
  this->fp_ = fp;
  pcVar1 = lib_copy_str(fname);
  this->fname_ = pcVar1;
  this->base_seek_ofs_ = base_ofs;
  os_get_abs_filename(fname_abs,0x1000,fname);
  os_get_path_name(path,0x1000,fname_abs);
  pcVar1 = lib_copy_str(path);
  this->path_ = pcVar1;
  this->ver_ = 0;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    pCVar2 = (CVmImagePool *)operator_new(0x28);
    (pCVar2->super_CVmPoolBackingStore)._vptr_CVmPoolBackingStore =
         (_func_int **)&PTR__CVmImagePool_0031d390;
    pCVar2->page_count_ = 0;
    pCVar2->page_size_ = 0;
    pCVar2->page_info_ = (CVmImagePool_pg **)0x0;
    pCVar2->fp_ = (CVmImageFile *)0x0;
    this->pools_[lVar5] = pCVar2;
  }
  this->field_0x90 = this->field_0x90 & 0xf0;
  this->runtime_symtab_ = (CVmRuntimeSymbols *)0x0;
  this->runtime_macros_ = (CVmRuntimeSymbols *)0x0;
  this->reflection_symtab_ = 0;
  this->reflection_macros_ = 0;
  pCVar3 = (CVmHashTable *)operator_new(0x20);
  pCVar4 = (CVmHashFunc *)operator_new(8);
  pCVar4->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0031c898;
  CVmHashTable::CVmHashTable(pCVar3,0x40,pCVar4,1);
  this->exports_ = pCVar3;
  pCVar3 = (CVmHashTable *)operator_new(0x20);
  pCVar4 = (CVmHashFunc *)operator_new(8);
  pCVar4->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0031c898;
  CVmHashTable::CVmHashTable(pCVar3,0x10,pCVar4,1);
  this->synth_exports_ = pCVar3;
  this->static_head_ = (CVmStaticInitPage *)0x0;
  this->static_tail_ = (CVmStaticInitPage *)0x0;
  this->static_cs_ofs_ = 0;
  return;
}

Assistant:

CVmImageLoader::CVmImageLoader(CVmImageFile *fp, const char *fname,
                               long base_ofs)
{
    size_t i;
    char fname_abs[OSFNMAX], path[OSFNMAX];
    
    /* remember the underlying image file interface */
    fp_ = fp;

    /* remember the image filename and the base seek offset */
    fname_ = lib_copy_str(fname);
    base_seek_ofs_ = base_ofs;

    /* save the file's fully-qualified, absolute directory path */
    os_get_abs_filename(fname_abs, sizeof(fname_abs), fname);
    os_get_path_name(path, sizeof(path), fname_abs);
    path_ = lib_copy_str(path);

    /* we don't know the file version yet */
    ver_ = 0;

    /* allocate the pool tracking objects */
    for (i = 0 ; i < sizeof(pools_)/sizeof(pools_[0]) ; ++i)
        pools_[i] = new CVmImagePool();

    /* no metaclass dependency table loaded yet */
    loaded_meta_dep_ = FALSE;

    /* no function set dependency table loaded yet */
    loaded_funcset_dep_ = FALSE;

    /* no entrypoint loaded yet */
    loaded_entrypt_ = FALSE;

    /* no GSYM block yet */
    has_gsym_ = FALSE;

    /* no runtime symbols loaded yet */
    runtime_symtab_ = 0;
    runtime_macros_ = 0;

    /* there's no reflection LookupTable yet */
    reflection_symtab_ = VM_INVALID_OBJ;
    reflection_macros_ = VM_INVALID_OBJ;

    /* create the exported symbol hash table */
    exports_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* create the synthesized exports hash table */
    synth_exports_ = new CVmHashTable(16, new CVmHashFuncCS(), TRUE);

    /* no static initializer pages yet */
    static_head_ = static_tail_ = 0;

    /* we don't have a static initializer code offset yet */
    static_cs_ofs_ = 0;
}